

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools.cpp
# Opt level: O2

VectorXd __thiscall
Tools::CalculateRMSE
          (Tools *this,
          vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
          *estimations,
          vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
          *ground_truth)

{
  double dVar1;
  double dVar2;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pCVar3;
  pointer pMVar4;
  ulong uVar5;
  Scalar *pSVar6;
  invalid_argument *this_00;
  long *in_RCX;
  DenseIndex extraout_RDX;
  DenseIndex DVar7;
  DenseIndex extraout_RDX_00;
  pointer pMVar8;
  int j;
  long lVar9;
  ulong uVar10;
  int i;
  Scalar SVar11;
  VectorXd VVar12;
  VectorXd residual;
  VectorXd current_estimate;
  VectorXd cur_ground_truth;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_50;
  
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix((Matrix<double,__1,_1,_0,__1,_1> *)this,4);
  local_50.m_row = 0;
  local_50.m_col = 1;
  local_50.m_currentBlockRows = 1;
  *this->_vptr_Tools = (_func_int *)0x0;
  current_estimate.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  local_50.m_xpr = (Matrix<double,__1,_1,_0,__1,_1> *)this;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (&local_50,(Scalar *)&current_estimate);
  cur_ground_truth.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar3,(Scalar *)&cur_ground_truth);
  residual.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
            (pCVar3,(Scalar *)&residual);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer(&local_50);
  pMVar8 = (ground_truth->
           super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pMVar4 = (ground_truth->
           super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pMVar4 == pMVar8) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this_00,"Error: Estimation vector size should not be zero");
  }
  else {
    if ((long)pMVar4 - (long)pMVar8 == in_RCX[1] - *in_RCX) {
      for (uVar10 = 0; uVar5 = (long)pMVar4 - (long)pMVar8 >> 4, uVar10 < uVar5; uVar10 = uVar10 + 1
          ) {
        Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(&current_estimate,pMVar8 + uVar10);
        Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
                  ((Matrix<double,__1,_1,_0,__1,_1> *)&cur_ground_truth,
                   (Matrix<double,__1,_1,_0,__1,_1> *)(uVar10 * 0x10 + *in_RCX));
        Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
                  ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                    *)&local_50,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&current_estimate,
                   (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&cur_ground_truth);
        Eigen::Matrix<double,-1,1,0,-1,1>::
        Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                  ((Matrix<double,_1,1,0,_1,1> *)&residual,
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    *)&local_50);
        for (lVar9 = 0;
            lVar9 < residual.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                    m_storage.m_rows; lVar9 = lVar9 + 1) {
          pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                              &residual,lVar9);
          dVar1 = *pSVar6;
          pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                              &residual,lVar9);
          dVar2 = *pSVar6;
          pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                              &residual,lVar9);
          *pSVar6 = dVar1 * dVar2;
        }
        Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+=
                  ((MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)this,
                   (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&residual);
        free(residual.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data);
        free(cur_ground_truth.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_data);
        free(current_estimate.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_data);
        pMVar8 = (ground_truth->
                 super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pMVar4 = (ground_truth->
                 super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      }
      local_50.m_xpr = (Matrix<double,__1,_1,_0,__1,_1> *)(double)(long)uVar5;
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator/=
                ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this,(Scalar *)&local_50);
      DVar7 = extraout_RDX;
      for (lVar9 = 0; lVar9 < (long)this[1]._vptr_Tools; lVar9 = lVar9 + 1) {
        pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this,lVar9
                           );
        dVar1 = *pSVar6;
        if (dVar1 < 0.0) {
          SVar11 = sqrt(dVar1);
        }
        else {
          SVar11 = SQRT(dVar1);
        }
        pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this,lVar9
                           );
        *pSVar6 = SVar11;
        DVar7 = extraout_RDX_00;
      }
      VVar12.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = DVar7
      ;
      VVar12.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)this;
      return (VectorXd)
             VVar12.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
    }
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this_00,"Error: Estimation vector size should equal ground truth size");
  }
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

VectorXd Tools::CalculateRMSE(const vector<VectorXd> &estimations,
                              const vector<VectorXd> &ground_truth) {
    VectorXd rmse(4);
    rmse << 0,0,0,0;

    if(estimations.size() < 1) {
        throw std::invalid_argument( "Error: Estimation vector size should not be zero");
    }
    else if(estimations.size() != ground_truth.size()) {
        throw std::invalid_argument( "Error: Estimation vector size should equal ground truth size");
    } else {
        //accumulate squared residuals
        for(int i=0; i < estimations.size(); ++i){
            VectorXd current_estimate = estimations[i];
            VectorXd cur_ground_truth = ground_truth[i];
            VectorXd residual = current_estimate - cur_ground_truth;
            for(int j=0; j<residual.size(); ++j) {
                residual[j] = residual[j] * residual[j];
            }
            rmse += residual;
        }

        //calculate the mean
        rmse /= estimations.size();

        //calculate the squared root
        for(int i=0; i<rmse.size(); ++i) {
            rmse[i] = sqrt(rmse[i]);
        }

        //return the result
        return rmse;
    }
}